

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatdesc.h
# Opt level: O1

void __thiscall FormatDescriptor::removeLastChannel(FormatDescriptor *this)

{
  uint32_t uVar1;
  pointer psVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  psVar2 = (this->samples).
           super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (ulong)((long)psVar2 -
                 (long)(this->samples).
                       super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  uVar5 = (uint)uVar6;
  if (uVar5 < 2) {
    __assert_fail("numChannels > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./formatdesc.h"
                  ,0x2eb,"void FormatDescriptor::removeLastChannel()");
  }
  uVar3 = *(ulong *)&(this->basic).field_0x8;
  uVar4 = uVar3 & 0xff;
  uVar6 = uVar6 & 0xffffffff;
  if ((int)(uVar4 % uVar6) == 0) {
    (this->samples).
    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>._M_impl.
    super__Vector_impl_data._M_finish = psVar2 + -1;
    *(ulong *)&(this->basic).field_0x8 =
         uVar3 & 0xffffffffffffff00 | (ulong)((int)(uVar4 / uVar6) * (uVar5 - 1) & 0xff);
    uVar1 = (this->extended).channelCount;
    if (uVar1 != 0) {
      (this->extended).channelCount = uVar1 - 1;
    }
    return;
  }
  __assert_fail("basic.bytesPlane0 % numChannels == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./formatdesc.h"
                ,0x2ec,"void FormatDescriptor::removeLastChannel()");
}

Assistant:

void removeLastChannel() {
        const auto numChannels = static_cast<uint32_t>(samples.size());
        assert(numChannels > 1);
        assert(basic.bytesPlane0 % numChannels == 0);
        samples.pop_back();
        basic.bytesPlane0 = basic.bytesPlane0 / numChannels * (numChannels - 1u);
        if (extended.channelCount != 0)
            --extended.channelCount;
    }